

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::replace_path_prefix
               (SmallVectorImpl<char> *Path,StringRef *OldPrefix,StringRef *NewPrefix,Style style)

{
  uint *puVar1;
  Style style_00;
  int iVar2;
  ulong __n;
  void *__s1;
  ulong uVar3;
  undefined1 local_1b8 [8];
  SmallString<256U> NewPath;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  undefined1 local_48 [8];
  StringRef RelPath;
  
  __n = OldPrefix->Length;
  RelPath.Length._4_4_ = style;
  if (__n == 0) {
    if (NewPrefix->Length == 0) {
      return;
    }
    __s1 = (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if (NewPrefix->Length == 0) goto LAB_00b262fd;
    uVar3 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  }
  else {
    uVar3 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    if (uVar3 < __n) {
      return;
    }
    __s1 = (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    iVar2 = bcmp(__s1,OldPrefix->Data,__n);
    if (iVar2 != 0) {
      return;
    }
    if (__n == NewPrefix->Length) {
LAB_00b262fd:
      memmove(__s1,NewPrefix->Data,__n);
      return;
    }
  }
  if (uVar3 < __n) {
    __n = uVar3;
  }
  local_48 = (undefined1  [8])((long)__s1 + __n);
  RelPath.Data = (char *)(uVar3 - __n);
  puVar1 = &NewPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  NewPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x10000000000;
  local_1b8 = (undefined1  [8])puVar1;
  Twine::Twine((Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                         InlineElts + 0xf8),NewPrefix);
  Twine::Twine(&local_90,"");
  style_00 = RelPath.Length._4_4_;
  Twine::Twine(&local_78,"");
  Twine::Twine(&local_60,"");
  append((SmallVectorImpl<char> *)local_1b8,style_00,
         (Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                   InlineElts + 0xf8),&local_90,&local_78,&local_60);
  Twine::Twine((Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                         InlineElts + 0xf8),(StringRef *)local_48);
  Twine::Twine(&local_90,"");
  Twine::Twine(&local_78,"");
  Twine::Twine(&local_60,"");
  append((SmallVectorImpl<char> *)local_1b8,style_00,
         (Twine *)(NewPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                   InlineElts + 0xf8),&local_90,&local_78,&local_60);
  SmallVectorImpl<char>::swap(Path,(SmallVectorImpl<char> *)local_1b8);
  if (local_1b8 != (undefined1  [8])puVar1) {
    free((void *)local_1b8);
  }
  return;
}

Assistant:

void replace_path_prefix(SmallVectorImpl<char> &Path,
                         const StringRef &OldPrefix, const StringRef &NewPrefix,
                         Style style) {
  if (OldPrefix.empty() && NewPrefix.empty())
    return;

  StringRef OrigPath(Path.begin(), Path.size());
  if (!OrigPath.startswith(OldPrefix))
    return;

  // If prefixes have the same size we can simply copy the new one over.
  if (OldPrefix.size() == NewPrefix.size()) {
    llvm::copy(NewPrefix, Path.begin());
    return;
  }

  StringRef RelPath = OrigPath.substr(OldPrefix.size());
  SmallString<256> NewPath;
  path::append(NewPath, style, NewPrefix);
  path::append(NewPath, style, RelPath);
  Path.swap(NewPath);
}